

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_manager.cpp
# Opt level: O2

void __thiscall
spvtools::opt::analysis::TypeManager::AttachDecoration
          (TypeManager *this,Instruction *inst,Type *type)

{
  Op opcode;
  pointer pOVar1;
  pointer pOVar2;
  bool bVar3;
  int iVar4;
  undefined4 extraout_var;
  uint32_t i;
  uint32_t uVar5;
  uint32_t i_1;
  uint32_t local_50;
  uint32_t local_4c;
  vector<unsigned_int,_std::allocator<unsigned_int>_> data;
  
  opcode = inst->opcode_;
  bVar3 = IsAnnotationInst(opcode);
  if (!bVar3) {
    return;
  }
  if (opcode != OpDecorateId) {
    if (opcode == OpMemberDecorate) {
      pOVar1 = (inst->operands_).
               super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      pOVar2 = (inst->operands_).
               super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
               _M_impl.super__Vector_impl_data._M_start;
      local_4c = Instruction::GetSingleWordOperand(inst,1);
      data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      for (uVar5 = 2; uVar5 < (uint)(((long)pOVar1 - (long)pOVar2) / 0x30); uVar5 = uVar5 + 1) {
        local_50 = Instruction::GetSingleWordOperand(inst,uVar5);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                  (&data,&local_50);
      }
      iVar4 = (*type->_vptr_Type[0x1d])(type);
      if ((Struct *)CONCAT44(extraout_var,iVar4) != (Struct *)0x0) {
        Struct::AddMemberDecoration((Struct *)CONCAT44(extraout_var,iVar4),local_4c,&data);
      }
      goto LAB_0049a4cf;
    }
    if (opcode != OpDecorate) {
      __assert_fail("false && \"Unexpected opcode for a decoration instruction.\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/type_manager.cpp"
                    ,0x42a,
                    "void spvtools::opt::analysis::TypeManager::AttachDecoration(const Instruction &, Type *)"
                   );
    }
  }
  pOVar1 = (inst->operands_).
           super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  pOVar2 = (inst->operands_).
           super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
           _M_impl.super__Vector_impl_data._M_start;
  data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  for (uVar5 = 1; uVar5 < (uint)(((long)pOVar1 - (long)pOVar2) / 0x30); uVar5 = uVar5 + 1) {
    local_50 = Instruction::GetSingleWordOperand(inst,uVar5);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
              (&data,&local_50);
  }
  std::
  vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
  ::emplace_back<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ((vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
              *)&type->decorations_,&data);
LAB_0049a4cf:
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  return;
}

Assistant:

void TypeManager::AttachDecoration(const Instruction& inst, Type* type) {
  const spv::Op opcode = inst.opcode();
  if (!IsAnnotationInst(opcode)) return;

  switch (opcode) {
    case spv::Op::OpDecorate:
    case spv::Op::OpDecorateId: {
      const auto count = inst.NumOperands();
      std::vector<uint32_t> data;
      for (uint32_t i = 1; i < count; ++i) {
        data.push_back(inst.GetSingleWordOperand(i));
      }
      type->AddDecoration(std::move(data));
    } break;
    case spv::Op::OpMemberDecorate: {
      const auto count = inst.NumOperands();
      const uint32_t index = inst.GetSingleWordOperand(1);
      std::vector<uint32_t> data;
      for (uint32_t i = 2; i < count; ++i) {
        data.push_back(inst.GetSingleWordOperand(i));
      }
      if (Struct* st = type->AsStruct()) {
        st->AddMemberDecoration(index, std::move(data));
      }
    } break;
    default:
      assert(false && "Unexpected opcode for a decoration instruction.");
      break;
  }
}